

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O2

void __thiscall
protozero::
basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
add_bool(basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,pbf_tag_type tag,bool value)

{
  assert_error *this_00;
  
  add_field(this,tag,varint);
  if (this->m_pos == 0) {
    if (this->m_data != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::__cxx11::string::push_back((char)this->m_data);
      return;
    }
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error(this_00,"m_data");
  }
  else {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error
              (this_00,
               "m_pos == 0 && \"you can\'t add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage\""
              );
  }
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void add_bool(pbf_tag_type tag, bool value) {
        add_field(tag, pbf_wire_type::varint);
        protozero_assert(m_pos == 0 && "you can't add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage");
        protozero_assert(m_data);
        m_data->push_back(static_cast<char>(value));
    }